

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>::
int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_>::on_oct
          (int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_> *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int_writer<fmt::v5::char8_t,fmt::v5::basic_format_specs<fmt::v5::char8_t>> *in_RDI;
  basic_format_specs<fmt::v5::char8_t> *in_stack_00000028;
  int in_stack_00000034;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
  *in_stack_00000038;
  int num_digits;
  undefined1 in_stack_00000048 [16];
  
  iVar3 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
          ::int_writer<fmt::v5::char8_t,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::
          count_digits<3u>(in_RDI);
  bVar2 = core_format_specs::has((core_format_specs *)(*(long *)(in_RDI + 8) + 0xc),8);
  if ((bVar2) && (*(int *)(*(long *)(in_RDI + 8) + 0xc) <= iVar3)) {
    uVar1 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar1 + 1;
    in_RDI[(ulong)uVar1 + 0x14] =
         (int_writer<fmt::v5::char8_t,fmt::v5::basic_format_specs<fmt::v5::char8_t>>)0x30;
  }
  get_prefix((int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_> *)
             0x2e81ae);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::
  write_int<fmt::v5::basic_format_specs<fmt::v5::char8_t>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<fmt::v5::char8_t,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::bin_writer<3>>
            (in_stack_00000038,in_stack_00000034,(string_view)in_stack_00000048,in_stack_00000028,
             (bin_writer<3>)this);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>();
      if (spec.has(HASH_FLAG) &&
          spec.precision <= num_digits) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<3>{abs_value, num_digits});
    }